

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::preRender
          (VaryingOutputCountCase *this,Context *ctx,GLuint programID)

{
  uint uVar1;
  TestError *pTVar2;
  GLuint texID;
  deInt32 emitCount [4];
  string local_40;
  
  if (this->m_test == READ_TEXTURE) {
    emitCount[0] = 0xff;
    emitCount[1] = 0xff00;
    emitCount[2] = 0xff0000;
    emitCount[3] = -0x1000000;
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,programID,"u_sampler");
    texID = 0;
    if (uVar1 == 0xffffffff) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"uniform location of u_sampler was -1.","");
      tcu::TestError::TestError(pTVar2,&local_40);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar1,0);
    (*ctx->_vptr_Context[7])(ctx,1,&texID);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)texID);
    (*ctx->_vptr_Context[0x11])(ctx,0xde1,0,0x8058,4,1,0,0x1908,0x1401,emitCount);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
  }
  else if (this->m_test == READ_UNIFORM) {
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,programID,"u_emitCount");
    emitCount[0] = 6;
    emitCount[1] = 0;
    emitCount[2] = this->m_maxEmitCount;
    emitCount[3] = 10;
    if (uVar1 == 0xffffffff) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"uniform location of u_emitCount was -1.","");
      tcu::TestError::TestError(pTVar2,&local_40);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*ctx->_vptr_Context[99])(ctx,(ulong)uVar1,1,emitCount);
  }
  return;
}

Assistant:

void VaryingOutputCountCase::preRender (sglr::Context& ctx, GLuint programID)
{
	if (m_test == VaryingOutputCountShader::READ_UNIFORM)
	{
		const int		location		= ctx.getUniformLocation(programID, "u_emitCount");
		const deInt32	emitCount[4]	= { 6, 0, m_maxEmitCount, 10 };

		if (location == -1)
			throw tcu::TestError("uniform location of u_emitCount was -1.");

		ctx.uniform4iv(location, 1, emitCount);
	}
	else if (m_test == VaryingOutputCountShader::READ_TEXTURE)
	{
		const deUint8 data[4*4] =
		{
			255,   0,   0,   0,
			  0, 255,   0,   0,
			  0,   0, 255,   0,
			  0,   0,   0, 255,
		};
		const int	location	= ctx.getUniformLocation(programID, "u_sampler");
		GLuint		texID		= 0;

		if (location == -1)
			throw tcu::TestError("uniform location of u_sampler was -1.");
		ctx.uniform1i(location, 0);

		// \note we don't need to explicitly delete the texture, the sglr context will delete it
		ctx.genTextures(1, &texID);
		ctx.bindTexture(GL_TEXTURE_2D, texID);
		ctx.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 4, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
		ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	}
}